

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

void __thiscall
cmCTestTestHandler::LogTestSummary
          (cmCTestTestHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *passed,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *failed,cmDuration *durationInSecs)

{
  cmCTest *pcVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  size_type sVar5;
  ostream *poVar6;
  long lVar7;
  void *this_00;
  char *pcVar8;
  rep_conflict rVar9;
  bool local_8e9;
  float local_86c;
  float local_854;
  string local_850 [32];
  undefined1 local_830 [8];
  ostringstream cmCTestLog_msg_1;
  char local_6b8 [8];
  char realBuf [1024];
  string local_2a0 [32];
  string local_280;
  string local_260;
  ostringstream local_240 [8];
  ostringstream cmCTestLog_msg;
  string local_c8;
  string local_98;
  string local_78 [8];
  string failedColorCode;
  string passColorCode;
  float percent;
  size_t total;
  cmDuration *durationInSecs_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *failed_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *passed_local;
  cmCTestTestHandler *this_local;
  
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(passed);
  sVar4 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(failed);
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(passed);
  local_854 = (float)sVar5;
  local_86c = (float)(sVar3 + sVar4);
  passColorCode.field_2._12_4_ = (local_854 * 100.0) / local_86c;
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(failed);
  if ((!bVar2) && (99.0 < (float)passColorCode.field_2._12_4_)) {
    passColorCode.field_2._12_4_ = 0x42c60000;
  }
  std::__cxx11::string::string((string *)(failedColorCode.field_2._M_local_buf + 8));
  std::__cxx11::string::string(local_78);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(failed);
  if (bVar2) {
    cmCTest::GetColorCode_abi_cxx11_(&local_98,(this->super_cmCTestGenericHandler).CTest,GREEN);
    std::__cxx11::string::operator=
              ((string *)(failedColorCode.field_2._M_local_buf + 8),(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
  }
  else {
    cmCTest::GetColorCode_abi_cxx11_(&local_c8,(this->super_cmCTestGenericHandler).CTest,RED);
    std::__cxx11::string::operator=(local_78,(string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_c8);
  }
  std::__cxx11::ostringstream::ostringstream(local_240);
  poVar6 = (ostream *)std::ostream::operator<<(local_240,std::endl<char,std::char_traits<char>>);
  poVar6 = std::operator<<(poVar6,(string *)(failedColorCode.field_2._M_local_buf + 8));
  lVar7 = std::lround((double)(ulong)(uint)passColorCode.field_2._12_4_);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,lVar7);
  poVar6 = std::operator<<(poVar6,"% tests passed");
  cmCTest::GetColorCode_abi_cxx11_(&local_260,(this->super_cmCTestGenericHandler).CTest,CLEAR_COLOR)
  ;
  poVar6 = std::operator<<(poVar6,(string *)&local_260);
  poVar6 = std::operator<<(poVar6,", ");
  poVar6 = std::operator<<(poVar6,local_78);
  sVar5 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(failed);
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,sVar5);
  poVar6 = std::operator<<(poVar6," tests failed");
  cmCTest::GetColorCode_abi_cxx11_(&local_280,(this->super_cmCTestGenericHandler).CTest,CLEAR_COLOR)
  ;
  poVar6 = std::operator<<(poVar6,(string *)&local_280);
  poVar6 = std::operator<<(poVar6," out of ");
  this_00 = (void *)std::ostream::operator<<(poVar6,sVar3 + sVar4);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string((string *)&local_280);
  std::__cxx11::string::~string((string *)&local_260);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar8 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x264,pcVar8,false);
  std::__cxx11::string::~string(local_2a0);
  std::__cxx11::ostringstream::~ostringstream(local_240);
  cmCTest::GetLabelsForSubprojects_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(realBuf + 0x3f8),(this->super_cmCTestGenericHandler).CTest);
  bVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(realBuf + 0x3f8));
  local_8e9 = false;
  if (!bVar2) {
    local_8e9 = cmCTest::GetSubprojectSummary((this->super_cmCTestGenericHandler).CTest);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(realBuf + 0x3f8));
  if (local_8e9 != false) {
    PrintLabelOrSubprojectSummary(this,true);
  }
  bVar2 = cmCTest::GetLabelSummary((this->super_cmCTestGenericHandler).CTest);
  if (bVar2) {
    PrintLabelOrSubprojectSummary(this,false);
  }
  rVar9 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(durationInSecs);
  snprintf(local_6b8,0x400,"%6.2f sec",rVar9);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_830);
  poVar6 = std::operator<<((ostream *)local_830,"\nTotal Test time (real) = ");
  poVar6 = std::operator<<(poVar6,local_6b8);
  std::operator<<(poVar6,"\n");
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  std::__cxx11::ostringstream::str();
  pcVar8 = (char *)std::__cxx11::string::c_str();
  cmCTest::Log(pcVar1,2,
               "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmCTestTestHandler.cxx"
               ,0x270,pcVar8,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
  std::__cxx11::string::~string(local_850);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_830);
  std::__cxx11::string::~string(local_78);
  std::__cxx11::string::~string((string *)(failedColorCode.field_2._M_local_buf + 8));
  return;
}

Assistant:

void cmCTestTestHandler::LogTestSummary(const std::vector<std::string>& passed,
                                        const std::vector<std::string>& failed,
                                        const cmDuration& durationInSecs)
{
  std::size_t total = passed.size() + failed.size();

  float percent =
    static_cast<float>(passed.size()) * 100.0f / static_cast<float>(total);
  if (!failed.empty() && percent > 99) {
    percent = 99;
  }

  std::string passColorCode;
  std::string failedColorCode;
  if (failed.empty()) {
    passColorCode = this->CTest->GetColorCode(cmCTest::Color::GREEN);
  } else {
    failedColorCode = this->CTest->GetColorCode(cmCTest::Color::RED);
  }
  cmCTestLog(this->CTest, HANDLER_OUTPUT,
             std::endl
               << passColorCode << std::lround(percent) << "% tests passed"
               << this->CTest->GetColorCode(cmCTest::Color::CLEAR_COLOR)
               << ", " << failedColorCode << failed.size() << " tests failed"
               << this->CTest->GetColorCode(cmCTest::Color::CLEAR_COLOR)
               << " out of " << total << std::endl);
  if ((!this->CTest->GetLabelsForSubprojects().empty() &&
       this->CTest->GetSubprojectSummary())) {
    this->PrintLabelOrSubprojectSummary(true);
  }
  if (this->CTest->GetLabelSummary()) {
    this->PrintLabelOrSubprojectSummary(false);
  }
  char realBuf[1024];
  snprintf(realBuf, sizeof(realBuf), "%6.2f sec", durationInSecs.count());
  cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                     "\nTotal Test time (real) = " << realBuf << "\n",
                     this->Quiet);
}